

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
ptc::Print<char>::print_backend<std::ostream&,char_const(&)[35]>
          (Print<char> *this,basic_ostream<char,_std::char_traits<char>_> *os,char (*first) [35])

{
  bool bVar1;
  ANSI in_EAX;
  ostream *poVar2;
  undefined8 local_28;
  
  local_28._0_4_ = in_EAX;
  std::mutex::lock((mutex *)mutex_);
  local_28 = (ulong)(ANSI)local_28;
  bVar1 = is_escape<char[35]>(first,(ANSI *)((long)&local_28 + 4));
  if ((bVar1) || ((this->pattern)._M_string_length == 0)) {
    std::operator<<((ostream *)os,*first);
  }
  else {
    poVar2 = std::operator<<((ostream *)os,(string *)&this->pattern);
    poVar2 = std::operator<<(poVar2,*first);
    std::operator<<(poVar2,(string *)&this->pattern);
  }
  std::operator<<((ostream *)os,(string *)this);
  local_28 = CONCAT44(local_28._4_4_,1);
  bVar1 = is_escape<char[35]>(first,(ANSI *)&local_28);
  if (bVar1) {
    std::operator<<((ostream *)os,"\x1b[0m");
  }
  if (this->flush == true) {
    std::ostream::flush();
  }
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }